

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void init_adf_data(warm_cb *data,size_t num_actions)

{
  multi_ex *this;
  example *peVar1;
  label *plVar2;
  label *plVar3;
  uint32_t i;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  size_t a;
  size_t sVar7;
  wclass local_40;
  
  data->num_actions = (uint32_t)num_actions;
  data->ws_type = data->sim_bandit + 1;
  this = &data->ecs;
  std::vector<example_*,_std::allocator<example_*>_>::resize(this,num_actions);
  for (sVar7 = 0; num_actions != sVar7; sVar7 = sVar7 + 1) {
    peVar1 = VW::alloc_examples(DAT_002eac48,1);
    (this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[sVar7] = peVar1;
    (*(code *)CB::cb_label)
              (&(this->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar7]->l);
  }
  plVar2 = calloc_or_throw<COST_SENSITIVE::label>(num_actions);
  data->csls = plVar2;
  for (uVar6 = 1; uVar5 = (ulong)(uVar6 - 1), uVar5 < num_actions; uVar6 = uVar6 + 1) {
    (*(code *)COST_SENSITIVE::cs_label)(data->csls + uVar5);
    local_40.x = 0.0;
    local_40.partial_prediction = 0.0;
    local_40.wap_value = 0.0;
    local_40.class_index = uVar6;
    v_array<COST_SENSITIVE::wclass>::push_back(&data->csls[uVar5].costs,&local_40);
  }
  plVar3 = calloc_or_throw<CB::label>(num_actions);
  data->cbls = plVar3;
  data->ws_train_size = data->ws_period;
  data->ws_vali_size = 0;
  data->ws_iter = 0;
  data->inter_iter = 0;
  setup_lambdas(data);
  for (uVar4 = 0; uVar4 < data->choices_lambda; uVar4 = uVar4 + 1) {
    local_40.x = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&data->cumulative_costs,&local_40.x);
  }
  data->cumu_var = 0.0;
  return;
}

Assistant:

void init_adf_data(warm_cb& data, const size_t num_actions)
{
  data.num_actions = num_actions;
  if (data.sim_bandit)
    data.ws_type = BANDIT_WS;
  else
    data.ws_type = SUPERVISED_WS;
  data.ecs.resize(num_actions);
  for (size_t a=0; a < num_actions; ++a)
  {
    data.ecs[a] = VW::alloc_examples(CB::cb_label.label_size, 1);
    auto& lab = data.ecs[a]->l.cb;
    CB::cb_label.default_label(&lab);
  }

	// The rest of the initialization is for warm start CB
	data.csls = calloc_or_throw<COST_SENSITIVE::label>(num_actions);
	for (uint32_t a=0; a < num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.default_label(&data.csls[a]);
		data.csls[a].costs.push_back({0, a+1, 0, 0});
	}
	data.cbls = calloc_or_throw<CB::label>(num_actions);

	data.ws_train_size = data.ws_period;
	data.ws_vali_size = 0;

	data.ws_iter = 0;
	data.inter_iter = 0;

	setup_lambdas(data);
	for (uint32_t i = 0; i < data.choices_lambda; i++)
		data.cumulative_costs.push_back(0.f);
	data.cumu_var = 0.f;
}